

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-dis.c
# Opt level: O3

easm_expr * getrbf(rbitfield *bf,ull *a,ull *m)

{
  int iVar1;
  int iVar2;
  anon_enum_32 aVar3;
  int iVar4;
  bool bVar5;
  int iVar6;
  easm_expr *peVar7;
  easm_expr *peVar8;
  byte bVar9;
  byte bVar10;
  bool bVar11;
  ulong uVar12;
  ulong uVar13;
  ulong num;
  long lVar14;
  
  iVar6 = bf->shr;
  lVar14 = 0;
  num = 0;
  bVar5 = true;
  do {
    bVar11 = bVar5;
    iVar1 = bf->sbf[lVar14].pos;
    iVar4 = iVar1 + 0x3f;
    if (-1 < iVar1) {
      iVar4 = iVar1;
    }
    iVar2 = bf->sbf[lVar14].len;
    uVar13 = ~(-1L << ((byte)iVar2 & 0x3f));
    bVar9 = (byte)(iVar1 % 0x40);
    uVar12 = uVar13 << (bVar9 & 0x3f);
    lVar14 = (long)(iVar4 >> 6);
    m[lVar14] = m[lVar14] | uVar12;
    uVar12 = (uVar12 & a[lVar14]) >> (bVar9 & 0x3f);
    if (0x40 < iVar1 % 0x40 + iVar2) {
      uVar13 = uVar13 >> (-bVar9 & 0x3f);
      m[lVar14 + 1] = m[lVar14 + 1] | uVar13;
      uVar12 = uVar12 | (uVar13 & a[lVar14 + 1]) << (-bVar9 & 0x3f);
    }
    num = num | uVar12 << ((byte)iVar6 & 0x3f);
    iVar6 = iVar6 + iVar2;
    lVar14 = 1;
    bVar5 = false;
  } while (bVar11);
  aVar3 = bf->mode;
  bVar9 = (byte)iVar6;
  if (aVar3 != RBF_ULTRASIGNED) {
    if (aVar3 == RBF_SLIGHTLY_SIGNED) {
      if ((num >> ((ulong)(byte)(bVar9 - 1) & 0x3f) & 1) == 0) goto LAB_00269253;
      bVar10 = bVar9 - 2;
    }
    else {
      if (aVar3 != RBF_SIGNED) goto LAB_00269253;
      bVar10 = bVar9 - 1;
    }
    if ((num >> ((ulong)bVar10 & 0x3f) & 1) == 0) goto LAB_00269253;
  }
  num = num + (-1L << (bVar9 & 0x3f));
LAB_00269253:
  if (bf->pcrel == 0) {
    peVar7 = easm_expr_num(EASM_EXPR_NUM,num + bf->addend);
    return peVar7;
  }
  peVar7 = easm_expr_simple(EASM_EXPR_POS);
  if (bf->pospreadd != 0) {
    peVar8 = easm_expr_num(EASM_EXPR_NUM,bf->pospreadd);
    peVar7 = easm_expr_bin(EASM_EXPR_ADD,peVar7,peVar8);
  }
  if (bf->shr != 0) {
    peVar8 = easm_expr_num(EASM_EXPR_NUM,-1L << ((byte)bf->shr & 0x3f));
    peVar7 = easm_expr_bin(EASM_EXPR_AND,peVar7,peVar8);
  }
  peVar8 = easm_expr_num(EASM_EXPR_NUM,num);
  peVar7 = easm_expr_bin(EASM_EXPR_ADD,peVar7,peVar8);
  if (bf->addend != 0) {
    peVar8 = easm_expr_num(EASM_EXPR_NUM,bf->addend);
    peVar7 = easm_expr_bin(EASM_EXPR_ADD,peVar7,peVar8);
    return peVar7;
  }
  return peVar7;
}

Assistant:

struct easm_expr *getrbf(const struct rbitfield *bf, ull *a, ull *m) {
	ull res = 0;
	int pos = bf->shr;
	int i;
	for (i = 0; i < sizeof(bf->sbf) / sizeof(bf->sbf[0]); i++) {
		res |= BF(bf->sbf[i].pos, bf->sbf[i].len) << pos;
		pos += bf->sbf[i].len;
	}
	switch (bf->mode) {
		case RBF_UNSIGNED:
			break;
		case RBF_SIGNED:
			if (res & 1ull << (pos - 1))
				res -= 1ull << pos;
			break;
		case RBF_SLIGHTLY_SIGNED:
			if (res & 1ull << (pos - 1) && res & 1ull << (pos - 2))
				res -= 1ull << pos;
			break;
		case RBF_ULTRASIGNED:
			res -= 1ull << pos;
			break;
	}
	if (bf->pcrel) {
		struct easm_expr *expr = easm_expr_simple(EASM_EXPR_POS);
		if (bf->pospreadd)
			expr = easm_expr_bin(EASM_EXPR_ADD, expr, easm_expr_num(EASM_EXPR_NUM, bf->pospreadd));
		if (bf->shr)
			expr = easm_expr_bin(EASM_EXPR_AND, expr, easm_expr_num(EASM_EXPR_NUM, -(1ull << bf->shr)));
		expr = easm_expr_bin(EASM_EXPR_ADD, expr, easm_expr_num(EASM_EXPR_NUM, res));
		if (bf->addend)
			expr = easm_expr_bin(EASM_EXPR_ADD, expr, easm_expr_num(EASM_EXPR_NUM, bf->addend));
		return expr;
	} else {
		res += bf->addend;
		return easm_expr_num(EASM_EXPR_NUM, res);
	}
}